

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.h
# Opt level: O3

void rapidjson::internal::DigitGen(DiyFp *W,DiyFp *Mp,uint64_t delta,char *buffer,int *len,int *K)

{
  int iVar1;
  uint64_t uVar2;
  byte bVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  char cVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  bool bVar16;
  
  bVar3 = -(char)Mp->e;
  uVar10 = 1L << (bVar3 & 0x3f);
  uVar7 = Mp->f;
  uVar15 = uVar7 >> (bVar3 & 0x3f);
  uVar2 = W->f;
  uVar4 = 1;
  uVar13 = (uint)uVar15;
  if (((((9 < uVar13) && (uVar4 = 2, 99 < uVar13)) && (uVar4 = 3, 999 < uVar13)) &&
      ((uVar4 = 4, 9999 < uVar13 && (uVar4 = 5, 99999 < uVar13)))) &&
     ((uVar4 = 6, 999999 < uVar13 && (uVar4 = 7, 9999999 < uVar13)))) {
    uVar4 = 9 - (uVar13 < 100000000);
  }
  uVar5 = uVar7 - uVar2;
  uVar6 = uVar10 - 1 & uVar7;
  *len = 0;
  do {
    uVar13 = (uint)uVar15;
    switch(uVar4) {
    case 0:
      iVar11 = -uVar4;
      do {
        uVar7 = delta;
        cVar12 = (char)(uVar6 * 10 >> (bVar3 & 0x3f));
        iVar1 = *len;
        if (cVar12 != '\0' || iVar1 != 0) {
          *len = iVar1 + 1;
          buffer[iVar1] = cVar12 + '0';
        }
        delta = uVar7 * 10;
        uVar6 = uVar6 * 10 & uVar10 - 1;
        iVar11 = iVar11 + 1;
      } while (delta < uVar6 || delta - uVar6 == 0);
      *K = *K - iVar11;
      if (iVar11 < 9) {
        uVar15 = (ulong)DigitGen::kPow10[iVar11];
      }
      else {
        uVar15 = 0;
      }
      if (uVar10 <= delta - uVar6) {
        uVar15 = uVar15 * uVar5;
        uVar5 = uVar15 - uVar6;
        if (uVar15 < uVar6 || uVar5 == 0) {
          return;
        }
        iVar11 = *len;
        uVar6 = uVar6 + uVar10;
        uVar7 = uVar7 * 10 - uVar6;
        do {
          if ((uVar15 <= uVar6) && (uVar5 <= uVar6 - uVar15)) {
            return;
          }
          buffer[(long)iVar11 + -1] = buffer[(long)iVar11 + -1] + -1;
          bVar16 = uVar10 <= uVar7;
          uVar7 = uVar7 - uVar10;
          if (uVar15 <= uVar6) {
            return;
          }
          uVar5 = uVar5 - uVar10;
          uVar6 = uVar6 + uVar10;
        } while (bVar16);
        return;
      }
      return;
    case 1:
      uVar8 = 0;
      goto LAB_0047f7c9;
    case 2:
      uVar14 = (uint)((uVar15 & 0xffffffff) / 10);
      iVar11 = (int)((uVar15 & 0xffffffff) / 10) * 10;
      break;
    case 3:
      uVar14 = (uint)((uVar15 & 0xffffffff) / 100);
      iVar11 = (int)((uVar15 & 0xffffffff) / 100) * 100;
      break;
    case 4:
      uVar14 = (uint)((uVar15 & 0xffffffff) / 1000);
      iVar11 = (int)((uVar15 & 0xffffffff) / 1000) * 1000;
      break;
    case 5:
      uVar14 = (uint)((uVar15 & 0xffffffff) / 10000);
      iVar11 = (int)((uVar15 & 0xffffffff) / 10000) * 10000;
      break;
    case 6:
      uVar14 = (uVar13 >> 5) / 0xc35;
      iVar11 = ((uVar13 >> 5) / 0xc35) * 100000;
      break;
    case 7:
      uVar14 = (uint)((uVar15 & 0xffffffff) / 1000000);
      iVar11 = (int)((uVar15 & 0xffffffff) / 1000000) * 1000000;
      break;
    case 8:
      uVar14 = (uint)((uVar15 & 0xffffffff) / 10000000);
      iVar11 = (int)((uVar15 & 0xffffffff) / 10000000) * 10000000;
      break;
    case 9:
      uVar14 = (uint)((uVar15 & 0xffffffff) / 100000000);
      iVar11 = (int)((uVar15 & 0xffffffff) / 100000000) * 100000000;
      break;
    default:
      iVar11 = *len;
      uVar8 = uVar13;
      goto LAB_0047f7e5;
    }
    uVar8 = uVar13 - iVar11;
    uVar13 = uVar14;
LAB_0047f7c9:
    iVar11 = *len;
    if (uVar13 == 0) {
      uVar15 = (ulong)uVar8;
LAB_0047f7e5:
      cVar12 = '0';
      if (iVar11 != 0) goto LAB_0047f7ed;
    }
    else {
      cVar12 = (char)uVar13 + '0';
LAB_0047f7ed:
      *len = iVar11 + 1;
      buffer[iVar11] = cVar12;
      uVar15 = (ulong)uVar8;
    }
    uVar4 = uVar4 - 1;
    uVar9 = ((uVar15 & 0xffffffff) << (bVar3 & 0x3f)) + uVar6;
    if (uVar9 <= delta) {
      *K = *K + uVar4;
      uVar10 = (ulong)DigitGen::kPow10[uVar4] << (bVar3 & 0x3f);
      if ((uVar9 < uVar5) && (uVar10 <= delta - uVar9)) {
        iVar11 = *len;
        uVar6 = uVar5 - uVar9;
        uVar9 = uVar9 + uVar10;
        uVar15 = delta - uVar9;
        do {
          if ((uVar5 <= uVar9) && (uVar6 <= (uVar2 - uVar7) + uVar9)) {
            return;
          }
          buffer[(long)iVar11 + -1] = buffer[(long)iVar11 + -1] + -1;
          bVar16 = uVar10 <= uVar15;
          uVar15 = uVar15 - uVar10;
          if (uVar5 <= uVar9) {
            return;
          }
          uVar6 = uVar6 - uVar10;
          uVar9 = uVar9 + uVar10;
        } while (bVar16);
      }
      return;
    }
  } while( true );
}

Assistant:

inline void DigitGen(const DiyFp& W, const DiyFp& Mp, uint64_t delta, char* buffer, int* len, int* K) {
    static const uint32_t kPow10[] = { 1, 10, 100, 1000, 10000, 100000, 1000000, 10000000, 100000000, 1000000000 };
    const DiyFp one(uint64_t(1) << -Mp.e, Mp.e);
    const DiyFp wp_w = Mp - W;
    uint32_t p1 = static_cast<uint32_t>(Mp.f >> -one.e);
    uint64_t p2 = Mp.f & (one.f - 1);
    unsigned kappa = CountDecimalDigit32(p1); // kappa in [0, 9]
    *len = 0;

    while (kappa > 0) {
        uint32_t d = 0;
        switch (kappa) {
            case  9: d = p1 /  100000000; p1 %=  100000000; break;
            case  8: d = p1 /   10000000; p1 %=   10000000; break;
            case  7: d = p1 /    1000000; p1 %=    1000000; break;
            case  6: d = p1 /     100000; p1 %=     100000; break;
            case  5: d = p1 /      10000; p1 %=      10000; break;
            case  4: d = p1 /       1000; p1 %=       1000; break;
            case  3: d = p1 /        100; p1 %=        100; break;
            case  2: d = p1 /         10; p1 %=         10; break;
            case  1: d = p1;              p1 =           0; break;
            default:;
        }
        if (d || *len)
            buffer[(*len)++] = static_cast<char>('0' + static_cast<char>(d));
        kappa--;
        uint64_t tmp = (static_cast<uint64_t>(p1) << -one.e) + p2;
        if (tmp <= delta) {
            *K += kappa;
            GrisuRound(buffer, *len, delta, tmp, static_cast<uint64_t>(kPow10[kappa]) << -one.e, wp_w.f);
            return;
        }
    }

    // kappa = 0
    for (;;) {
        p2 *= 10;
        delta *= 10;
        char d = static_cast<char>(p2 >> -one.e);
        if (d || *len)
            buffer[(*len)++] = static_cast<char>('0' + d);
        p2 &= one.f - 1;
        kappa--;
        if (p2 < delta) {
            *K += kappa;
            int index = -static_cast<int>(kappa);
            GrisuRound(buffer, *len, delta, p2, one.f, wp_w.f * (index < 9 ? kPow10[-static_cast<int>(kappa)] : 0));
            return;
        }
    }
}